

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::integral_image<unsigned_char,long>(image *this,ConstPtr *image)

{
  bool bVar1;
  int width_00;
  int height_00;
  int chans_00;
  invalid_argument *this_00;
  ImageBase *pIVar2;
  TypedImageBase<long> *pTVar3;
  size_type __n;
  TypedImageBase<unsigned_char> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Ptr PVar5;
  int local_84;
  int local_80;
  int i;
  int cc;
  int y;
  long *prev;
  long *dest;
  uchar *inrow;
  value_type_conflict8 local_58;
  undefined1 local_50 [8];
  vector<long,_std::allocator<long>_> zeros;
  int row_stride;
  int chans;
  int height;
  int width;
  ConstPtr *image_local;
  Ptr *ret;
  
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  width_00 = ImageBase::width(pIVar2);
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  height_00 = ImageBase::height(pIVar2);
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  chans_00 = ImageBase::channels(pIVar2);
  zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = width_00 * chans_00;
  zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  Image<long>::create();
  pTVar3 = &std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this)->super_TypedImageBase<long>;
  TypedImageBase<long>::allocate(pTVar3,width_00,height_00,chans_00);
  __n = (size_type)
        zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
  local_58 = 0;
  std::allocator<long>::allocator((allocator<long> *)((long)&inrow + 7));
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_50,__n,&local_58,
             (allocator<long> *)((long)&inrow + 7));
  std::allocator<long>::~allocator((allocator<long> *)((long)&inrow + 7));
  this_01 = &std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image)->super_TypedImageBase<unsigned_char>;
  dest = (long *)TypedImageBase<unsigned_char>::get_data_pointer(this_01);
  pTVar3 = &std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this)->super_TypedImageBase<long>;
  prev = TypedImageBase<long>::get_data_pointer(pTVar3);
  _cc = std::vector<long,_std::allocator<long>_>::operator[]
                  ((vector<long,_std::allocator<long>_> *)local_50,0);
  for (i = 0; i < height_00; i = i + 1) {
    for (local_80 = 0; local_84 = chans_00, local_80 < chans_00; local_80 = local_80 + 1) {
      prev[local_80] = (ulong)*(byte *)((long)dest + (long)local_80) + _cc[local_80];
    }
    for (; local_84 <
           zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_; local_84 = local_84 + 1) {
      prev[local_84] =
           ((ulong)*(byte *)((long)dest + (long)local_84) + _cc[local_84] +
           prev[local_84 - chans_00]) - _cc[local_84 - chans_00];
    }
    _cc = prev;
    prev = prev + zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
    dest = (long *)((long)dest +
                   (long)zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 1;
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_50)
  ;
  _Var4._M_pi = extraout_RDX;
  if ((zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._3_1_ & 1) == 0) {
    std::shared_ptr<core::Image<long>_>::~shared_ptr((shared_ptr<core::Image<long>_> *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  PVar5.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  PVar5.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar5.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T_OUT>::Ptr
integral_image (typename Image<T_IN>::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    int const width = image->width();
    int const height = image->height();
    int const chans = image->channels();
    int const row_stride = width * chans;

    typename Image<T_OUT>::Ptr ret(Image<T_OUT>::create());
    ret->allocate(width, height, chans);

    /* Input image row and destination image rows. */
    std::vector<T_OUT> zeros(row_stride, T_OUT(0));
    T_IN const* inrow = image->get_data_pointer();
    T_OUT* dest = ret->get_data_pointer();
    T_OUT* prev = &zeros[0];

    /*
     * I(x,y) = i(x,y) + I(x-1,y) + I(x,y-1) - I(x-1,y-1)
     */
    for (int y = 0; y < height; ++y)
    {
        /* Calculate first pixel in row. */
        for (int cc = 0; cc < chans; ++cc)
            dest[cc] = static_cast<T_OUT>(inrow[cc]) + prev[cc];
        /* Calculate all following pixels in row. */
        for (int i = chans; i < row_stride; ++i)
            dest[i] = inrow[i] + prev[i] + dest[i - chans] - prev[i - chans];

        prev = dest;
        dest += row_stride;
        inrow += row_stride;
    }

    return ret;
}